

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void SerializeObject(CJSON *json)

{
  File *pFVar1;
  ostream *poVar2;
  string local_1d8;
  undefined1 local_1b2;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  undefined1 local_162;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  undefined1 local_112;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_89;
  string local_88;
  undefined1 local_68 [8];
  Folder dir;
  CJSON *json_local;
  
  dir.m_Files.super__Vector_base<std::shared_ptr<File>,_std::allocator<std::shared_ptr<File>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)json;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Test",&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"/home/test",&local_c1);
  Folder::Folder((Folder *)local_68,&local_88,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  pFVar1 = (File *)operator_new(0x48);
  local_112 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Test.png",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"/home/test/Test",&local_111);
  File::File(pFVar1,&local_e8,&local_110,0x800);
  local_112 = 0;
  Folder::AddFile((Folder *)local_68,pFVar1);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  pFVar1 = (File *)operator_new(0x48);
  local_162 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"Test.txt",&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"/home/test/Test",&local_161);
  File::File(pFVar1,&local_138,&local_160,0x200);
  local_162 = 0;
  Folder::AddFile((Folder *)local_68,pFVar1);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  pFVar1 = (File *)operator_new(0x48);
  local_1b2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"Test.mp3",&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"/home/test/Test",&local_1b1);
  File::File(pFVar1,&local_188,&local_1b0,10000000);
  local_1b2 = 0;
  Folder::AddFile((Folder *)local_68,pFVar1);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  poVar2 = std::operator<<((ostream *)&std::cout,"Folder: ");
  CJSON::Serialize<Folder,_nullptr>
            (&local_1d8,
             (CJSON *)dir.m_Files.
                      super__Vector_base<std::shared_ptr<File>,_std::allocator<std::shared_ptr<File>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(Folder *)local_68);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_1d8);
  Folder::~Folder((Folder *)local_68);
  return;
}

Assistant:

void SerializeObject(CJSON &json)
{
    Folder dir("Test", "/home/test");
    dir.AddFile(new File("Test.png", "/home/test/Test", 2048));
    dir.AddFile(new File("Test.txt", "/home/test/Test", 512));
    dir.AddFile(new File("Test.mp3", "/home/test/Test", 10000000));

    cout << "Folder: " << json.Serialize(dir) << endl;
}